

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

int cmd_load(char *arg)

{
  size_t sVar1;
  char *__haystack;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  
  sVar1 = strlen(arg);
  if (sVar1 < 6) {
    puts("load [-i] <model-name> [<other-model-names> ...]");
    puts("\t-i         - make all the imported modules implemented");
    iVar6 = 1;
  }
  else {
    __haystack = strdup(arg + 4);
    for (pcVar2 = strstr(__haystack,"-i"); pcVar2 != (char *)0x0; pcVar2 = strstr(pcVar2 + 2,"-i"))
    {
      if ((pcVar2[2] & 0xdfU) == 0) {
        ly_ctx_set_allimplemented(ctx);
        pcVar2[0] = ' ';
        pcVar2[1] = ' ';
      }
    }
    pcVar5 = __haystack + -1;
    pcVar2 = pcVar5;
    do {
      pcVar5 = pcVar5 + 1;
      pcVar3 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar3 == ' ');
    pcVar3 = strchr(pcVar2,0x20);
    if (pcVar3 == (char *)0x0) {
      sVar1 = strlen(pcVar2);
    }
    else {
      sVar1 = (long)pcVar3 - (long)pcVar5;
    }
    pcVar5 = strndup(pcVar2,(long)(int)sVar1);
    if (pcVar5 == (char *)0x0) {
      iVar6 = 0;
    }
    else {
      while( true ) {
        lVar4 = ly_ctx_load_module(ctx,pcVar5,0);
        free(pcVar5);
        if (lVar4 == 0) break;
        pcVar5 = pcVar2 + (long)(int)sVar1 + -1;
        pcVar2 = pcVar5;
        do {
          pcVar5 = pcVar5 + 1;
          pcVar3 = pcVar2 + 1;
          pcVar2 = pcVar2 + 1;
        } while (*pcVar3 == ' ');
        pcVar3 = strchr(pcVar2,0x20);
        if (pcVar3 == (char *)0x0) {
          sVar1 = strlen(pcVar2);
        }
        else {
          sVar1 = (long)pcVar3 - (long)pcVar5;
        }
        iVar6 = 0;
        if (((int)sVar1 == 0) ||
           (pcVar5 = strndup(pcVar2,(long)(int)sVar1), iVar6 = 0, pcVar5 == (char *)0x0))
        goto LAB_00107d05;
      }
      iVar6 = 1;
    }
LAB_00107d05:
    free(__haystack);
    ly_ctx_unset_allimplemented(ctx);
  }
  return iVar6;
}

Assistant:

int
cmd_load(const char *arg)
{
    int name_len, ret = 1;
    char *name, *s, *arg_ptr;
    const struct lys_module *model;

    if (strlen(arg) < 6) {
        cmd_load_help();
        return 1;
    }

    arg_ptr = strdup(arg + 4 /* ignore "load" */);

    for (s = strstr(arg_ptr, "-i"); s ; s = strstr(s + 2, "-i")) {
        if (s[2] == '\0' || s[2] == ' ') {
            ly_ctx_set_allimplemented(ctx);
            s[0] = s[1] = ' ';
        }
    }
    s = arg_ptr;

    while (arg_ptr[0] == ' ') {
        ++arg_ptr;
    }
    if (strchr(arg_ptr, ' ')) {
        name_len = strchr(arg_ptr, ' ') - arg_ptr;
    } else {
        name_len = strlen(arg_ptr);
    }
    name = strndup(arg_ptr, name_len);

    while (name) {
        model = ly_ctx_load_module(ctx, name, NULL);
        free(name);
        if (!model) {
            /* libyang printed the error messages */
            goto cleanup;
        }

        /* next model */
        arg_ptr += name_len;
        while (arg_ptr[0] == ' ') {
            ++arg_ptr;
        }
        if (strchr(arg_ptr, ' ')) {
            name_len = strchr(arg_ptr, ' ') - arg_ptr;
        } else {
            name_len = strlen(arg_ptr);
        }

        if (name_len) {
            name = strndup(arg_ptr, name_len);
        } else {
            name = NULL;
        }
    }
    ret = 0;

cleanup:
    free(s);
    ly_ctx_unset_allimplemented(ctx);

    return ret;
}